

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseModuleFieldList(WastParser *this,Module *module)

{
  ModuleFieldType MVar1;
  ResolveTypes *pRVar2;
  ResolveFuncs *pRVar3;
  Errors *errors;
  bool bVar4;
  bool bVar5;
  Result RVar6;
  TokenTypePair pair;
  reference pMVar7;
  __node_base *p_Var8;
  ResolveTypes *pRVar9;
  ResolveFuncs *pRVar10;
  Func *func;
  _func_int **pp_Var11;
  FuncDeclaration *decl;
  ImportModuleField *import_field;
  iterator rhs;
  iterator __begin2;
  ResolveFuncTypesExprVisitorDelegate delegate;
  ResolveTypes it;
  ReferenceVars local_78 [3];
  
  std::vector<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>::
  clear(&this->resolve_types_);
  std::vector<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>::
  clear(&this->resolve_funcs_);
LAB_001800e4:
  do {
    pair = PeekPair(this);
    bVar4 = anon_unknown_1::IsModuleField(pair);
    if ((!bVar4) && (bVar4 = PeekIsCustom(this), !bVar4)) {
      pRVar2 = (this->resolve_types_).
               super__Vector_base<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar4 = false;
      for (pRVar9 = (this->resolve_types_).
                    super__Vector_base<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
                    ._M_impl.super__Vector_impl_data._M_start; pRVar9 != pRVar2; pRVar9 = pRVar9 + 1
          ) {
        ResolveTypes::ResolveTypes(&it,pRVar9);
        RVar6 = ResolveRefTypes(module,it.target_types,&it.vars,this->errors_);
        bVar4 = (bool)(bVar4 | RVar6.enum_ == Error);
        std::vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
        ::~vector(&it.vars);
      }
      pRVar3 = (this->resolve_funcs_).
               super__Vector_base<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pRVar10 = (this->resolve_funcs_).
                     super__Vector_base<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
                     ._M_impl.super__Vector_impl_data._M_start; pRVar10 != pRVar3;
          pRVar10 = pRVar10 + 1) {
        ResolveFuncs::ResolveFuncs((ResolveFuncs *)&it,pRVar10);
        RVar6 = ResolveRefTypes(module,(TypeVector *)&it.vars,local_78,this->errors_);
        bVar4 = (bool)(bVar4 | RVar6.enum_ == Error);
        LocalTypes::Set((LocalTypes *)
                        &it.target_types[6].
                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(TypeVector *)&it.vars);
        ResolveFuncs::~ResolveFuncs((ResolveFuncs *)&it);
      }
      if (bVar4) {
        return (Result)Error;
      }
      errors = this->errors_;
      __begin2.node_ = (module->fields).first_;
      bVar4 = false;
      __begin2.list_ = &module->fields;
      do {
        rhs.node_ = (ModuleField *)0x0;
        rhs.list_ = &module->fields;
        bVar5 = intrusive_list<wabt::ModuleField>::iterator::operator!=(&__begin2,rhs);
        if (!bVar5) {
          if (!bVar4) {
            RVar6 = ResolveNamesModule(module,this->errors_);
            return (Result)(uint)(RVar6.enum_ == Error);
          }
          return (Result)Error;
        }
        pMVar7 = intrusive_list<wabt::ModuleField>::iterator::operator*(&__begin2);
        MVar1 = pMVar7->type_;
        if (MVar1 == Tag) {
          decl = (FuncDeclaration *)&pMVar7[1].loc.filename._M_str;
LAB_001802b8:
          func = (Func *)0x0;
LAB_001802ba:
          bVar5 = anon_unknown_1::ResolveFuncTypeWithEmptySignature(module,decl);
          anon_unknown_1::ResolveImplicitlyDefinedFunctionType(&pMVar7->loc,module,decl);
          RVar6 = anon_unknown_1::CheckFuncTypeVarMatchesExplicit(&pMVar7->loc,module,decl,errors);
          bVar4 = RVar6.enum_ == Error || bVar4;
          if (func != (Func *)0x0) {
            if (bVar5) {
              p_Var8 = &(func->bindings).
                        super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                        ._M_h._M_before_begin;
              while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
                *(int *)&p_Var8[9]._M_nxt =
                     *(int *)&p_Var8[9]._M_nxt +
                     (int)((ulong)((long)(func->decl).sig.param_types.
                                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(func->decl).sig.param_types.
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 3);
              }
            }
            delegate.super_DelegateNop.super_Delegate._vptr_Delegate =
                 (Delegate)&PTR__Delegate_0024d1d8;
            delegate.module_ = module;
            delegate.errors_ = errors;
            ExprVisitor::ExprVisitor((ExprVisitor *)&it,(Delegate *)&delegate);
            RVar6 = ExprVisitor::VisitFunc((ExprVisitor *)&it,func);
            bVar4 = bVar4 || RVar6.enum_ == Error;
            ExprVisitor::~ExprVisitor((ExprVisitor *)&it);
          }
        }
        else {
          if (MVar1 == Import) {
            pp_Var11 = pMVar7[1]._vptr_ModuleField;
            if (pp_Var11 == (_func_int **)0x0 || *(int *)(pp_Var11 + 9) != 0) {
              if (*(int *)(pp_Var11 + 9) != 4) {
                pp_Var11 = (_func_int **)0x0;
              }
              if (pp_Var11 == (_func_int **)0x0) goto LAB_0018037f;
            }
            decl = (FuncDeclaration *)(pp_Var11 + 0xe);
            goto LAB_001802b8;
          }
          if (MVar1 == Func) {
            func = (Func *)(pMVar7 + 1);
            decl = (FuncDeclaration *)&pMVar7[1].loc.filename._M_str;
            goto LAB_001802ba;
          }
        }
LAB_0018037f:
        intrusive_list<wabt::ModuleField>::iterator::operator++(&__begin2);
      } while( true );
    }
    bVar4 = PeekIsCustom(this);
    if (bVar4) {
      RVar6 = ParseCustomSectionAnnotation(this,module);
    }
    else {
      RVar6 = ParseModuleField(this,module);
      if (RVar6.enum_ != Error) goto LAB_001800e4;
      RVar6 = Synchronize(this,anon_unknown_1::IsModuleField);
    }
    if (RVar6.enum_ == Error) {
      return (Result)Error;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseModuleFieldList(Module* module) {
  WABT_TRACE(ParseModuleFieldList);

  // Reset module-specific state.
  resolve_types_.clear();
  resolve_funcs_.clear();

  while (IsModuleField(PeekPair()) || PeekIsCustom()) {
    if (PeekIsCustom()) {
      CHECK_RESULT(ParseCustomSectionAnnotation(module));
      continue;
    }
    if (Failed(ParseModuleField(module))) {
      CHECK_RESULT(Synchronize(IsModuleField));
    }
  }

  // Module parsing is completed, type names can be resolved now.
  Result result = Result::Ok;

  for (auto it : resolve_types_) {
    result |= ResolveRefTypes(*module, it.target_types, &it.vars, errors_);
  }

  for (auto it : resolve_funcs_) {
    result |= ResolveRefTypes(*module, &it.types, &it.vars, errors_);
    it.target_func->local_types.Set(it.types);
  }

  CHECK_RESULT(result);
  CHECK_RESULT(ResolveFuncTypes(module, errors_));
  CHECK_RESULT(ResolveNamesModule(module, errors_));
  return Result::Ok;
}